

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  int iVar1;
  uint uVar2;
  float in_XMM0_Da;
  float in_XMM1_Da;
  
  uVar2 = (uint)size;
  if (uVar2 != 0) {
    if ((window->SetWindowSizeAllowFlags & uVar2) == 0) {
      return;
    }
    if ((uVar2 & uVar2 - 1) != 0) {
      __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1b91,"void SetWindowSize(ImGuiWindow *, const ImVec2 &, ImGuiCond)");
    }
  }
  window->SetWindowSizeAllowFlags = window->SetWindowSizeAllowFlags & 0xfffffff1;
  if (in_XMM0_Da <= 0.0) {
    window->AutoFitOnlyGrows = false;
    iVar1 = 2;
  }
  else {
    (window->SizeFull).x = in_XMM0_Da;
    iVar1 = 0;
  }
  window->AutoFitFramesX = iVar1;
  if (in_XMM1_Da <= 0.0) {
    window->AutoFitFramesY = 2;
    window->AutoFitOnlyGrows = false;
    return;
  }
  window->AutoFitFramesY = 0;
  (window->SizeFull).y = in_XMM1_Da;
  return;
}

Assistant:

static void SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    if (size.x > 0.0f)
    {
        window->AutoFitFramesX = 0;
        window->SizeFull.x = size.x;
    }
    else
    {
        window->AutoFitFramesX = 2;
        window->AutoFitOnlyGrows = false;
    }
    if (size.y > 0.0f)
    {
        window->AutoFitFramesY = 0;
        window->SizeFull.y = size.y;
    }
    else
    {
        window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
}